

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonArrayLengthFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  u32 uVar1;
  JsonParse *pParse;
  uchar *zPath_00;
  char *zPath;
  JsonNode *pNode;
  long lStack_30;
  u32 i;
  sqlite3_int64 n;
  JsonParse *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *ctx_local;
  
  lStack_30 = 0;
  pParse = jsonParseCached(ctx,argv,ctx);
  if (pParse != (JsonParse *)0x0) {
    if (argc == 2) {
      zPath_00 = sqlite3_value_text(argv[1]);
      zPath = (char *)jsonLookup(pParse,(char *)zPath_00,(int *)0x0,ctx);
    }
    else {
      zPath = (char *)pParse->aNode;
    }
    if (zPath != (char *)0x0) {
      if (*zPath == '\x06') {
        for (pNode._4_4_ = 1; pNode._4_4_ <= *(uint *)(zPath + 4); pNode._4_4_ = uVar1 + pNode._4_4_
            ) {
          uVar1 = jsonNodeSize((JsonNode *)(zPath + (ulong)pNode._4_4_ * 0x10));
          lStack_30 = lStack_30 + 1;
        }
      }
      sqlite3_result_int64(ctx,lStack_30);
    }
  }
  return;
}

Assistant:

static void jsonArrayLengthFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p;          /* The parse */
  sqlite3_int64 n = 0;
  u32 i;
  JsonNode *pNode;

  p = jsonParseCached(ctx, argv, ctx);
  if( p==0 ) return;
  assert( p->nNode );
  if( argc==2 ){
    const char *zPath = (const char*)sqlite3_value_text(argv[1]);
    pNode = jsonLookup(p, zPath, 0, ctx);
  }else{
    pNode = p->aNode;
  }
  if( pNode==0 ){
    return;
  }
  if( pNode->eType==JSON_ARRAY ){
    assert( (pNode->jnFlags & JNODE_APPEND)==0 );
    for(i=1; i<=pNode->n; n++){
      i += jsonNodeSize(&pNode[i]);
    }
  }
  sqlite3_result_int64(ctx, n);
}